

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

SESSION_HANDLE
session_create(CONNECTION_HANDLE connection,ON_LINK_ATTACHED on_link_attached,void *callback_context
              )

{
  SESSION_INSTANCE *session_instance;
  ENDPOINT_HANDLE pEVar1;
  
  if ((connection != (CONNECTION_HANDLE)0x0) &&
     (session_instance = (SESSION_INSTANCE *)calloc(1,0x70),
     session_instance != (SESSION_INSTANCE *)0x0)) {
    session_instance->connection = connection;
    session_instance->link_endpoints = (LINK_ENDPOINT_INSTANCE **)0x0;
    session_instance->link_endpoint_count = 0;
    session_instance->next_outgoing_id = 0;
    session_instance->desired_incoming_window = 1;
    session_instance->incoming_window = 1;
    session_instance->outgoing_window = 1;
    session_instance->handle_max = 0xffffffff;
    session_instance->remote_incoming_window = 0;
    session_instance->remote_outgoing_window = 0;
    session_instance->field_0x68 = session_instance->field_0x68 & 0xfe;
    session_instance->session_state = SESSION_STATE_UNMAPPED;
    session_instance->previous_session_state = SESSION_STATE_UNMAPPED;
    session_instance->on_link_attached = on_link_attached;
    session_instance->on_link_attached_callback_context = callback_context;
    pEVar1 = connection_create_endpoint(connection);
    session_instance->endpoint = pEVar1;
    if (pEVar1 != (ENDPOINT_HANDLE)0x0) {
      session_set_state(session_instance,SESSION_STATE_UNMAPPED);
      return session_instance;
    }
    free(session_instance);
  }
  return (SESSION_HANDLE)0x0;
}

Assistant:

SESSION_HANDLE session_create(CONNECTION_HANDLE connection, ON_LINK_ATTACHED on_link_attached, void* callback_context)
{
    SESSION_INSTANCE* result;

    if (connection == NULL)
    {
        /* Codes_S_R_S_SESSION_01_031: [If connection is NULL, session_create shall fail and return NULL.] */
        result = NULL;
    }
    else
    {
        /* Codes_S_R_S_SESSION_01_030: [session_create shall create a new session instance and return a non-NULL handle to it.] */
        result = (SESSION_INSTANCE*)calloc(1, sizeof(SESSION_INSTANCE));
        /* Codes_S_R_S_SESSION_01_042: [If allocating memory for the session fails, session_create shall fail and return NULL.] */
        if (result != NULL)
        {
            result->connection = connection;
            result->link_endpoints = NULL;
            result->link_endpoint_count = 0;
            result->handle_max = 4294967295u;

            /* Codes_S_R_S_SESSION_01_057: [The delivery ids shall be assigned starting at 0.] */
            /* Codes_S_R_S_SESSION_01_017: [The nextoutgoing-id MAY be initialized to an arbitrary value ] */
            result->next_outgoing_id = 0;

            result->desired_incoming_window = 1;
            result->incoming_window = 1;
            result->outgoing_window = 1;
            result->handle_max = 4294967295u;
            result->remote_incoming_window = 0;
            result->remote_outgoing_window = 0;
            result->previous_session_state = SESSION_STATE_UNMAPPED;
            result->is_underlying_connection_open = UNDERLYING_CONNECTION_NOT_OPEN;
            result->session_state = SESSION_STATE_UNMAPPED;
            result->on_link_attached = on_link_attached;
            result->on_link_attached_callback_context = callback_context;

            /* Codes_S_R_S_SESSION_01_032: [session_create shall create a new session endpoint by calling connection_create_endpoint.] */
            result->endpoint = connection_create_endpoint(connection);
            if (result->endpoint == NULL)
            {
                /* Codes_S_R_S_SESSION_01_033: [If connection_create_endpoint fails, session_create shall fail and return NULL.] */
                free(result);
                result = NULL;
            }
            else
            {
                session_set_state(result, SESSION_STATE_UNMAPPED);
            }
        }
    }

    return result;
}